

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QList<unsigned_short>>::emplace<QList<unsigned_short>const&>
          (QMovableArrayOps<QList<unsigned_short>> *this,qsizetype i,QList<unsigned_short> *args)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  Data *pDVar4;
  unsigned_short *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_006732e5:
    pDVar4 = (args->d).d;
    puVar5 = (args->d).ptr;
    lVar7 = (args->d).size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<QList<unsigned_short>_>::detachAndGrow
              ((QArrayDataPointer<QList<unsigned_short>_> *)this,(uint)(i == 0 && lVar3 != 0),1,
               (QList<unsigned_short> **)0x0,(QArrayDataPointer<QList<unsigned_short>_> *)0x0);
    lVar6 = *(long *)(this + 8);
    if (i == 0 && lVar3 != 0) {
      *(Data **)(lVar6 + -0x18) = pDVar4;
      *(unsigned_short **)(lVar6 + -0x10) = puVar5;
      *(long *)(lVar6 + -8) = lVar7;
      *(long *)(this + 8) = lVar6 + -0x18;
      i = *(long *)(this + 0x10);
      goto LAB_0067338b;
    }
    plVar1 = (long *)(lVar6 + i * 0x18);
    memmove(plVar1 + 3,(void *)(lVar6 + i * 0x18),(*(long *)(this + 0x10) - i) * 0x18);
    *plVar1 = (long)pDVar4;
    plVar1[1] = (long)puVar5;
    plVar1[2] = lVar7;
  }
  else {
    lVar7 = *(long *)(this + 0x10);
    if ((lVar7 != i) ||
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) - i ==
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) * -0x5555555555555555)) {
      if ((i == 0) &&
         (uVar8 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != uVar8)) {
        pDVar4 = (args->d).d;
        *(Data **)(uVar8 - 0x18) = pDVar4;
        *(unsigned_short **)(uVar8 - 0x10) = (args->d).ptr;
        *(qsizetype *)(uVar8 - 8) = (args->d).size;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          uVar8 = *(ulong *)(this + 8);
          lVar7 = *(long *)(this + 0x10);
        }
        *(ulong *)(this + 8) = uVar8 - 0x18;
        i = lVar7;
        goto LAB_0067338b;
      }
      goto LAB_006732e5;
    }
    pDVar4 = (args->d).d;
    *(Data **)(lVar3 + i * 0x18) = pDVar4;
    *(unsigned_short **)(lVar3 + 8 + i * 0x18) = (args->d).ptr;
    *(qsizetype *)(lVar3 + 0x10 + i * 0x18) = (args->d).size;
    if (pDVar4 == (Data *)0x0) goto LAB_0067338b;
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  i = *(long *)(this + 0x10);
LAB_0067338b:
  *(qsizetype *)(this + 0x10) = i + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }